

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O0

C_Node * compute_vla_size(C_Parser *parser,C_Type *ty,C_Token *tok)

{
  C_Node *pCVar1;
  C_Obj *pCVar2;
  C_Node *rhs;
  C_Node *expr;
  C_Node *base_sz;
  C_Node *node;
  C_Token *tok_local;
  C_Type *ty_local;
  C_Parser *parser_local;
  
  base_sz = new_node(parser,ND_NULL_EXPR,tok);
  if (ty->base != (C_Type *)0x0) {
    pCVar1 = compute_vla_size(parser,ty->base,tok);
    base_sz = new_binary(parser,ND_COMMA,base_sz,pCVar1,tok);
  }
  if (ty->kind == TY_VLA) {
    if (ty->base->kind == TY_VLA) {
      expr = new_var_node(parser,ty->base->vla_size,tok);
    }
    else {
      expr = new_num(parser,(long)ty->base->size,tok);
    }
    pCVar2 = new_lvar(parser,"",C_ty_ulong);
    ty->vla_size = pCVar2;
    pCVar1 = new_var_node(parser,ty->vla_size,tok);
    rhs = new_binary(parser,ND_MUL,ty->vla_len,expr,tok);
    pCVar1 = new_binary(parser,ND_ASSIGN,pCVar1,rhs,tok);
    parser_local = (C_Parser *)new_binary(parser,ND_COMMA,base_sz,pCVar1,tok);
  }
  else {
    parser_local = (C_Parser *)base_sz;
  }
  return (C_Node *)parser_local;
}

Assistant:

static C_Node *compute_vla_size(C_Parser *parser, C_Type *ty, C_Token *tok) {
  C_Node *node = new_node(parser, ND_NULL_EXPR, tok);
  if (ty->base)
    node = new_binary(parser, ND_COMMA, node, compute_vla_size(parser, ty->base, tok), tok);

  if (ty->kind != TY_VLA)
    return node;

  C_Node *base_sz;
  if (ty->base->kind == TY_VLA)
    base_sz = new_var_node(parser, ty->base->vla_size, tok);
  else
    base_sz = new_num(parser, ty->base->size, tok);

  ty->vla_size = new_lvar(parser, "", C_ty_ulong);
  C_Node *expr = new_binary(parser, ND_ASSIGN, new_var_node(parser, ty->vla_size, tok),
                          new_binary(parser, ND_MUL, ty->vla_len, base_sz, tok),
                          tok);
  return new_binary(parser, ND_COMMA, node, expr, tok);
}